

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

mcpl_generic_wfilehandle_t * mcpl_generic_wfopen(char *filename)

{
  FILE *pFVar1;
  char *in_RSI;
  mcpl_generic_wfilehandle_t *in_RDI;
  char *unaff_retaddr;
  mcpl_generic_wfilehandle_t *res;
  
  in_RDI->mode = 0;
  in_RDI->current_pos = 0;
  in_RDI->internal = (void *)0x0;
  pFVar1 = mcpl_internal_fopen(unaff_retaddr,in_RSI);
  in_RDI->internal = pFVar1;
  if (in_RDI->internal == (void *)0x0) {
    mcpl_error((char *)0x109046);
  }
  return in_RDI;
}

Assistant:

mcpl_generic_wfilehandle_t mcpl_generic_wfopen( const char * filename )
{
  mcpl_generic_wfilehandle_t res;
  res.mode = 0;
  res.current_pos = 0;
  res.internal = NULL;
  res.internal = (void*)mcpl_internal_fopen(filename,"wb");
  if (!res.internal)
    mcpl_error("Unable to open file for writing!");
  return res;
}